

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int indexCellCompare(BtCursor *pCur,int idx,UnpackedRecord *pIdxKey,RecordCompare xRecordCompare)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  MemPage *pPage;
  byte *pbVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(CONCAT11(*(undefined1 *)(*(long *)(pCur->aiIdx + 4) + (ulong)(uint)idx * 2),
                           *(undefined1 *)(*(long *)(pCur->aiIdx + 4) + 1 + (ulong)(uint)idx * 2)) &
                 *(ushort *)((long)&pCur->pKey + 2));
  pbVar1 = (byte *)(*(long *)(pCur->aiIdx + 8) + uVar7);
  pbVar6 = pbVar1 + 1;
  bVar2 = *pbVar1;
  if (bVar2 <= *(byte *)((long)&pCur->pBtree + 3)) {
    iVar5 = (*xRecordCompare)((uint)bVar2,pbVar6,pIdxKey);
    return iVar5;
  }
  bVar3 = *pbVar6;
  if ((-1 < (char)bVar3) &&
     (uVar4 = (bVar2 & 0x7f) << 7 | (int)(char)bVar3, uVar4 <= *(ushort *)((long)&pCur->pBtree + 6))
     ) {
    iVar5 = (*xRecordCompare)(uVar4,(void *)(*(long *)(pCur->aiIdx + 8) + uVar7 + 2),pIdxKey);
    return iVar5;
  }
  return 99;
}

Assistant:

static int indexCellCompare(
  BtCursor *pCur,
  int idx,
  UnpackedRecord *pIdxKey,
  RecordCompare xRecordCompare
){
  MemPage *pPage = pCur->pPage;
  int c;
  int nCell;  /* Size of the pCell cell in bytes */
  u8 *pCell = findCellPastPtr(pPage, idx);

  nCell = pCell[0];
  if( nCell<=pPage->max1bytePayload ){
    /* This branch runs if the record-size field of the cell is a
    ** single byte varint and the record fits entirely on the main
    ** b-tree page.  */
    testcase( pCell+nCell+1==pPage->aDataEnd );
    c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
  }else if( !(pCell[1] & 0x80)
    && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
  ){
    /* The record-size field is a 2 byte varint and the record
    ** fits entirely on the main b-tree page.  */
    testcase( pCell+nCell+2==pPage->aDataEnd );
    c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
  }else{
    /* If the record extends into overflow pages, do not attempt
    ** the optimization. */
    c = 99;
  }
  return c;
}